

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_typed_attr<std::__cxx11::string>
          (string *__return_storage_ptr__,tinyusdz *this,
          TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *attr,string *name,uint32_t indent)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  tinyusdz tVar2;
  string *psVar3;
  tinyusdz tVar4;
  byte bVar5;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pTVar6;
  bool bVar7;
  ostream *poVar8;
  long lVar9;
  uint32_t indent_00;
  uint32_t n;
  uint32_t n_00;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t n_01;
  undefined8 extraout_RDX;
  size_type sVar10;
  char *pcVar11;
  bool bVar12;
  bool bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> a;
  stringstream ss;
  string local_270;
  undefined4 local_24c;
  string *local_248;
  undefined4 local_23c;
  tinyusdz local_238;
  storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230 [32];
  byte local_210;
  char local_20f;
  TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_208;
  string *local_1e8;
  TypedAttribute<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_248 = name;
  local_1e0 = attr;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  tVar2 = this[0x228];
  if ((((tVar2 != (tinyusdz)0x0) || (*(long *)(this + 0x218) != *(long *)(this + 0x210))) ||
      (this[0x208] != (tinyusdz)0x0)) || (this[0x278] == (tinyusdz)0x1)) {
    lVar9 = *(long *)(this + 0x218);
    if ((lVar9 == *(long *)(this + 0x210) && tVar2 == (tinyusdz)0x0) &&
       (this[0x278] == (tinyusdz)0x0)) {
      local_24c = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),this[0x208]);
    }
    else {
      local_24c = 0;
    }
    bVar12 = lVar9 != *(long *)(this + 0x210);
    local_238 = tVar2;
    local_1e8 = __return_storage_ptr__;
    if (((byte)tVar2 ^ 1) == 0) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::construct_value(local_230,(value_type *)(this + 0x230));
    }
    bVar5 = local_210;
    tVar4 = local_238;
    indent_00 = (uint32_t)lVar9;
    if (local_238 == (tinyusdz)0x1) {
      if (local_208._dirty == true) {
        TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::update(&local_208);
      }
      local_23c = (undefined4)
                  CONCAT71((int7)((ulong)local_208._samples.
                                         super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                                         ._M_impl.super__Vector_impl_data._M_finish >> 8),
                           local_208._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_finish !=
                           local_208._samples.
                           super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
                           ._M_impl.super__Vector_impl_data._M_start);
    }
    else {
      local_23c = 0;
    }
    if (((local_238 == (tinyusdz)0x1) && (local_20f == '\0')) && (local_210 == 0)) {
      bVar13 = local_208._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_208._samples.
               super__Vector_base<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Sample>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      bVar13 = false;
    }
    bVar7 = AttrMetas::authored((AttrMetas *)this);
    pTVar6 = local_1e0;
    if (((bVar7) || ((byte)(bVar12 & ((byte)tVar2 ^ 1) | bVar13) != 1)) ||
       (n_01 = n,
       ((char)local_24c != '\0' || this[0x278] != (tinyusdz)0x0) || ((byte)tVar4 & bVar5) != 0)) {
      pprint::Indent_abi_cxx11_(&local_270,(pprint *)local_248,n);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
      paVar1 = &local_270.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT17(local_270.field_2._M_local_buf[7],
                                 CONCAT16(local_270.field_2._M_local_buf[6],
                                          CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                   local_270.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_270.field_2._M_allocated_capacity._0_4_ = 0x69727473;
      local_270.field_2._M_allocated_capacity._4_2_ = 0x676e;
      local_270._M_string_length = 6;
      local_270.field_2._M_local_buf[6] = '\0';
      local_270._M_dataplus._M_p = (pointer)paVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(pTVar6->_metas).interpolation,(long)(pTVar6->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT17(local_270.field_2._M_local_buf[7],
                                 CONCAT16(local_270.field_2._M_local_buf[6],
                                          CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                   local_270.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      if (this[0x278] == (tinyusdz)0x1) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = None",7);
      }
      else if (((byte)tVar4 & bVar5) != 0) {
        local_270._M_string_length = 0;
        local_270.field_2._M_allocated_capacity._0_4_ =
             local_270.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
        local_270._M_dataplus._M_p = (pointer)paVar1;
        if (local_238 == (tinyusdz)0x0) goto LAB_002f3d3d;
        if ((local_20f == '\0') && (local_210 == 1)) {
          ::std::__cxx11::string::_M_assign((string *)&local_270);
          ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8," = ",3);
          sVar10 = local_270._M_string_length;
          pcVar11 = local_270._M_dataplus._M_p;
        }
        else {
          pcVar11 = " = [InternalError]";
          sVar10 = 0x12;
        }
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar11,sVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT17(local_270.field_2._M_local_buf[7],
                                   CONCAT16(local_270.field_2._M_local_buf[6],
                                            CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                     local_270.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
      }
      bVar12 = AttrMetas::authored((AttrMetas *)this);
      if (bVar12) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(\n",2);
        psVar3 = local_248;
        print_attr_metas_abi_cxx11_
                  (&local_270,this,(AttrMeta *)(ulong)((int)local_248 + 1),indent_00);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
        pprint::Indent_abi_cxx11_(&local_1d8,(pprint *)((ulong)psVar3 & 0xffffffff),n_00);
        poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar8,")",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != paVar1) {
          operator_delete(local_270._M_dataplus._M_p,
                          CONCAT17(local_270.field_2._M_local_buf[7],
                                   CONCAT16(local_270.field_2._M_local_buf[6],
                                            CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                     local_270.field_2._M_allocated_capacity._0_4_))
                                  ) + 1);
        }
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX;
    }
    if ((char)local_23c != '\0') {
      pprint::Indent_abi_cxx11_(&local_270,(pprint *)local_248,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
      paVar1 = &local_270.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT17(local_270.field_2._M_local_buf[7],
                                 CONCAT16(local_270.field_2._M_local_buf[6],
                                          CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                   local_270.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_270.field_2._M_allocated_capacity._0_4_ = 0x69727473;
      local_270.field_2._M_allocated_capacity._4_2_ = 0x676e;
      local_270._M_string_length = 6;
      local_270.field_2._M_local_buf[6] = '\0';
      local_270._M_dataplus._M_p = (pointer)paVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(pTVar6->_metas).interpolation,(long)(pTVar6->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT17(local_270.field_2._M_local_buf[7],
                                 CONCAT16(local_270.field_2._M_local_buf[6],
                                          CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                   local_270.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".timeSamples = ",0xf);
      if (local_238 == (tinyusdz)0x0) {
LAB_002f3d3d:
        __assert_fail("has_value()",
                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                      ,0x584,
                      "const value_type &nonstd::optional_lite::optional<tinyusdz::Animatable<std::basic_string<char>>>::value() const [T = tinyusdz::Animatable<std::basic_string<char>>]"
                     );
      }
      print_typed_timesamples<std::__cxx11::string>
                (&local_270,(tinyusdz *)&local_208,
                 (TypedTimeSamples<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_248,indent_00);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT17(local_270.field_2._M_local_buf[7],
                                 CONCAT16(local_270.field_2._M_local_buf[6],
                                          CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                   local_270.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      n_01 = extraout_EDX_00;
    }
    if (*(long *)(this + 0x218) != *(long *)(this + 0x210)) {
      pprint::Indent_abi_cxx11_(&local_270,(pprint *)local_248,n_01);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_270._M_dataplus._M_p,local_270._M_string_length);
      paVar1 = &local_270.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT17(local_270.field_2._M_local_buf[7],
                                 CONCAT16(local_270.field_2._M_local_buf[6],
                                          CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                   local_270.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      local_270.field_2._M_allocated_capacity._0_4_ = 0x69727473;
      local_270.field_2._M_allocated_capacity._4_2_ = 0x676e;
      local_270._M_string_length = 6;
      local_270.field_2._M_local_buf[6] = '\0';
      local_270._M_dataplus._M_p = (pointer)paVar1;
      poVar8 = ::std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,paVar1->_M_local_buf,6);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,(char *)(pTVar6->_metas).interpolation,(long)(pTVar6->_metas).elementSize);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != paVar1) {
        operator_delete(local_270._M_dataplus._M_p,
                        CONCAT17(local_270.field_2._M_local_buf[7],
                                 CONCAT16(local_270.field_2._M_local_buf[6],
                                          CONCAT24(local_270.field_2._M_allocated_capacity._4_2_,
                                                   local_270.field_2._M_allocated_capacity._0_4_)))
                        + 1);
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,".connect = ",0xb);
      lVar9 = (*(long *)(this + 0x218) - (long)*(Path **)(this + 0x210) >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (lVar9 == 0) {
        ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"[InternalError]",0xf);
      }
      else if (lVar9 == 1) {
        ::std::operator<<(local_1a8,*(Path **)(this + 0x210));
      }
      else {
        ::std::operator<<(local_1a8,
                          (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)(this + 0x210))
        ;
      }
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    }
    __return_storage_ptr__ = local_1e8;
    if (local_238 == (tinyusdz)0x1) {
      nonstd::optional_lite::detail::
      storage_t<tinyusdz::Animatable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::destruct_value(local_230);
      __return_storage_ptr__ = local_1e8;
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string print_typed_attr(const TypedAttribute<Animatable<T>> &attr,
                             const std::string &name, const uint32_t indent) {
  std::stringstream ss;

  if (attr.authored()) {

    bool is_value_empty = attr.is_value_empty();
    bool is_connection = attr.is_connection();
    bool has_default{false};
    bool has_timesamples{false};
    bool is_timesamples{false};
    const auto &pv = attr.get_value();

    has_default = (pv && pv.value().has_default());
    has_timesamples = (pv && pv.value().has_timesamples());
    is_timesamples = (pv && pv.value().is_timesamples());

    DCOUT("name " << name);
    DCOUT("is_value_empty " << is_value_empty);
    DCOUT("is_connection " << is_connection);
    DCOUT("is_timesamples " << is_timesamples);
    DCOUT("has_timesamples " << has_timesamples);
    DCOUT("has_default " << has_default);

    //
    // Emit default value(includes ValueBlock and empty definition) and metada
    //
    // float a METADATA
    // float a = None METADATA
    // float a = 1.5 METADATA
    // 
    // Also emit this line if the attribute contains metadata
    // Do not emit when Attribute is connection only or timesamples only.
    if (attr.metas().authored() || attr.is_blocked() || has_default || is_value_empty || ((!is_connection) && (!is_timesamples))) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      if (attr.is_blocked()) {
        ss << " = None";
      } else if (has_default) {
        T a;
        if (pv.value().get_scalar(&a)) {
          ss << " = " << a;
        } else {
          ss << " = [InternalError]";
        }
      } else { // is_value_empty
      }

      if (attr.metas().authored()) {
        ss << "(\n"
           << print_attr_metas(attr.metas(), indent + 1) << pprint::Indent(indent)
           << ")";
      }
      ss << "\n";
    }

    // timesamples
    if (has_timesamples) {
      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;
      ss << ".timeSamples = "
         << print_typed_timesamples(pv.value().get_timesamples(), indent);
      ss << "\n";
    }

    // connection
    if (attr.has_connections()) {

      ss << pprint::Indent(indent);
      ss << value::TypeTraits<T>::type_name() << " " << name;

      ss << ".connect = ";
      const std::vector<Path> &paths = attr.get_connections();
      if (paths.size() == 1) {
        ss << paths[0];
      } else if (paths.size() == 0) {
        ss << "[InternalError]";
      } else {
        ss << paths;
      }
      ss << "\n";
    }

  }

  return ss.str();
}